

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

void __thiscall irr::video::CNullDriver::deleteShaderMaterial(CNullDriver *this,s32 material)

{
  pointer pSVar1;
  uint uVar2;
  IMaterialRenderer *pIVar3;
  
  if (4 < (uint)material) {
    pSVar1 = (this->MaterialRenderers).m_data.
             super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (uint)(((long)(this->MaterialRenderers).m_data.
                          super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x28);
    if ((uint)material < uVar2) {
      if (uVar2 - 1 == material) {
        pIVar3 = pSVar1[(uint)material].Renderer;
        if (pIVar3 != (IMaterialRenderer *)0x0) {
          IReferenceCounted::drop
                    ((IReferenceCounted *)
                     ((long)&pIVar3->_vptr_IMaterialRenderer +
                     (long)pIVar3->_vptr_IMaterialRenderer[0xfffffffffffffffd]));
        }
        core::array<irr::video::CNullDriver::SMaterialRenderer>::erase
                  (&this->MaterialRenderers,material);
        return;
      }
      pIVar3 = pSVar1[(uint)material].Renderer;
      if (pIVar3 != (IMaterialRenderer *)0x0) {
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   ((long)&pIVar3->_vptr_IMaterialRenderer +
                   (long)pIVar3->_vptr_IMaterialRenderer[0xfffffffffffffffd]));
      }
      pIVar3 = (IMaterialRenderer *)operator_new(0x20);
      *(undefined8 *)&pIVar3->field_0x10 = 0;
      *(undefined4 *)&pIVar3->field_0x18 = 1;
      pIVar3->_vptr_IMaterialRenderer = (_func_int **)0x2807f0;
      *(undefined8 *)&pIVar3->field_0x8 = 0x280848;
      pSVar1[(uint)material].Renderer = pIVar3;
      core::string<char>::clear(&pSVar1[(uint)material].Name,true);
      return;
    }
  }
  return;
}

Assistant:

void CNullDriver::deleteShaderMaterial(s32 material)
{
	const u32 idx = (u32)material;
	if (idx < numBuiltInMaterials || idx >= MaterialRenderers.size())
		return;

	// if this is the last material we can drop it without consequence
	if (idx == MaterialRenderers.size() - 1) {
		if (MaterialRenderers[idx].Renderer)
			MaterialRenderers[idx].Renderer->drop();
		MaterialRenderers.erase(idx);
		return;
	}
	// otherwise replace with a dummy renderer, we have to preserve the IDs
	auto &ref = MaterialRenderers[idx];
	if (ref.Renderer)
		ref.Renderer->drop();
	ref.Renderer = new CDummyMaterialRenderer();
	ref.Name.clear();
}